

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.cpp
# Opt level: O3

void __thiscall OpenMD::GB::calcForce(GB *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  char cVar3;
  char cVar4;
  pointer piVar5;
  uint i_2;
  long lVar6;
  uint i;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double tmp;
  double tmp_1;
  double tmp_2;
  double dVar17;
  double dVar18;
  double dVar19;
  Vector<double,_3U> result_7;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result_4;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result;
  Vector<double,_3U> result_3;
  Vector<double,_3U> result_1;
  double local_298 [4];
  double local_278 [4];
  double local_258 [4];
  double local_238 [4];
  double local_218;
  double local_208;
  double local_1f8;
  ulong uStack_1f0;
  double local_1e8;
  double local_1d8 [4];
  double local_1b8 [5];
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168 [4];
  double local_148;
  double local_130;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  ulong uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8 [4];
  double local_a8 [4];
  double local_88 [4];
  double local_68;
  ulong uStack_60;
  double local_58;
  ulong uStack_50;
  double local_48 [4];
  double local_28 [3];
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar5 = (this->GBtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar5[idat->atid1]].
                    super__Vector_base<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar7 = (long)piVar5[idat->atid2] * 0x50;
  local_1e8 = *(double *)(lVar6 + lVar7);
  local_108 = *(double *)(lVar6 + 8 + lVar7);
  local_180 = *(double *)(lVar6 + 0x10 + lVar7);
  local_e8 = *(double *)(lVar6 + 0x18 + lVar7);
  local_100 = *(double *)(lVar6 + 0x20 + lVar7);
  local_f8 = *(double *)(lVar6 + 0x28 + lVar7);
  local_1f8 = *(double *)(lVar6 + 0x30 + lVar7);
  uStack_1f0 = 0;
  local_170 = *(double *)(lVar6 + 0x38 + lVar7);
  local_f0 = *(double *)(lVar6 + 0x40 + lVar7);
  local_1b8[2] = (idat->A1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                 [2];
  local_1b8[0] = (idat->A1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                 [0];
  local_1b8[1] = (idat->A1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                 [1];
  local_1d8[2] = (idat->A2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                 [2];
  local_1d8[0] = (idat->A2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                 [0];
  local_1d8[1] = (idat->A2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                 [1];
  cVar3 = *(char *)(lVar6 + 0x48 + lVar7);
  if (cVar3 == '\x01') {
    local_1b8[2] = (double)OpenMD::V3Zero._16_8_;
    local_1b8[0] = (double)OpenMD::V3Zero._0_8_;
    local_1b8[1] = (double)OpenMD::V3Zero._8_8_;
    local_178 = 0.0;
  }
  else {
    local_178 = 0.0;
    lVar8 = 0;
    do {
      local_178 = local_178 + (idat->d).super_Vector<double,_3U>.data_[lVar8] * local_1b8[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
  }
  cVar4 = *(char *)(lVar6 + lVar7 + 0x49);
  if (cVar4 == '\x01') {
    local_1d8[2] = (double)OpenMD::V3Zero._16_8_;
    local_1d8[0] = (double)OpenMD::V3Zero._0_8_;
    local_1d8[1] = (double)OpenMD::V3Zero._8_8_;
    local_188 = 0.0;
    local_110 = 0.0;
  }
  else {
    local_188 = 0.0;
    lVar6 = 0;
    do {
      local_188 = local_188 + (idat->d).super_Vector<double,_3U>.data_[lVar6] * local_1d8[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_110 = 0.0;
    if (cVar3 == '\0' && cVar4 == '\0') {
      lVar6 = 0;
      do {
        local_110 = local_110 + local_1b8[lVar6] * local_1d8[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
    }
  }
  local_178 = local_178 / idat->rij;
  local_188 = local_188 / idat->rij;
  local_218 = 1.0 - local_e8 * local_110 * local_110;
  local_d8 = (local_e8 * -2.0 * local_178 * local_188 * local_110 +
             local_100 * local_178 * local_178 + local_f8 * local_188 * local_188) / local_218;
  dVar10 = local_188 * local_188 * local_f0;
  dVar19 = local_178 * local_178 * local_170;
  dVar18 = local_1f8 * -2.0 * local_178 * local_188 * local_110;
  local_208 = 1.0 - local_110 * local_110 * local_1f8;
  uStack_d0 = 0;
  dVar15 = 1.0 - local_d8;
  uStack_e0 = 0;
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    dVar15 = SQRT(dVar15);
  }
  local_68 = -local_e8;
  uStack_60 = uStack_e0 ^ 0x8000000000000000;
  local_58 = -local_1f8;
  uStack_50 = uStack_1f0 ^ 0x8000000000000000;
  dVar19 = (dVar18 + dVar19 + dVar10) / local_208;
  local_148 = local_1e8 / dVar15;
  if (local_218 < 0.0) {
    dVar15 = sqrt(local_218);
  }
  else {
    dVar15 = SQRT(local_218);
  }
  local_190 = 1.0 - dVar19;
  local_130 = pow(1.0 / dVar15,this->nu_);
  dVar14 = pow(local_190,this->mu_);
  dVar15 = idat->rij;
  dVar10 = idat->vdwMult;
  dVar11 = (local_1e8 * local_180) / ((dVar15 - local_148) + local_1e8 * local_180);
  dVar13 = dVar11 * dVar11 * dVar11;
  dVar13 = dVar13 * dVar13;
  dVar12 = dVar13 * dVar13 - dVar13;
  dVar18 = this->mu_;
  dVar1 = this->nu_;
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_168[2] = 0.0;
  lVar6 = 0;
  do {
    local_168[lVar6] = (idat->d).super_Vector<double,_3U>.data_[lVar6] / dVar15;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  dVar14 = local_108 * local_130 * dVar14;
  local_28[2] = local_168[2];
  local_28[0] = local_168[0];
  local_28[1] = local_168[1];
  dVar2 = (idat->d).super_Vector<double,_3U>.data_[0];
  dVar9 = (idat->d).super_Vector<double,_3U>.data_[1];
  dVar17 = (idat->d).super_Vector<double,_3U>.data_[2];
  local_168[0] = dVar9 * local_1b8[2] - local_1b8[1] * dVar17;
  local_168[1] = dVar17 * local_1b8[0] - local_1b8[2] * dVar2;
  dVar16 = dVar10 * 4.0 * dVar14 * dVar12;
  local_168[2] = dVar2 * local_1b8[1] - local_1b8[0] * dVar9;
  local_48[0] = dVar9 * local_1d8[2] - dVar17 * local_1d8[1];
  local_48[1] = dVar17 * local_1d8[0] - dVar2 * local_1d8[2];
  local_48[2] = dVar2 * local_1d8[1] - local_1d8[0] * dVar9;
  local_88[0] = local_1d8[2] * local_1b8[1] - local_1b8[2] * local_1d8[1];
  local_88[1] = local_1d8[0] * local_1b8[2] - local_1b8[0] * local_1d8[2];
  local_88[2] = local_1b8[0] * local_1d8[1] - local_1d8[0] * local_1b8[1];
  dVar2 = idat->sw;
  dVar9 = dVar16 * dVar2;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar9;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar9 + (idat->selePot).data_[1];
  }
  local_148 = local_148 * local_148 * local_148;
  dVar11 = dVar11 * dVar13;
  dVar9 = local_1e8 * local_1e8 * local_1e8;
  dVar17 = (dVar10 * -8.0 * dVar14 * dVar18 * dVar12) / (local_190 * dVar15);
  dVar10 = ((dVar13 * dVar11 * 6.0 + dVar11 * -3.0) * dVar10 * 8.0 * dVar14 * local_148) /
           (local_180 * dVar15 * dVar9);
  local_298[0] = 0.0;
  local_298[1] = 0.0;
  local_298[2] = 0.0;
  lVar6 = 0;
  do {
    local_298[lVar6] =
         local_28[lVar6] *
         -(dVar17 * dVar19 + ((local_1e8 * local_1e8 * dVar15) / local_148 + local_d8) * dVar10);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  dVar15 = ((local_170 * local_178 + local_58 * local_188 * local_110) * dVar17) / local_208 +
           ((local_100 * local_178 + local_68 * local_188 * local_110) * dVar10) / local_218;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  lVar6 = 0;
  do {
    local_a8[lVar6] = local_1b8[lVar6] * dVar15;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  dVar19 = (dVar14 * 4.0 * dVar1 * dVar12 * local_e8 * local_110) / local_218 +
           (((local_1f8 * local_178 * local_188 - local_1f8 * dVar19 * local_110) *
            dVar14 * 8.0 * dVar18 * dVar12) / local_208) / local_190 +
           (((local_e8 * local_178 * local_188 - local_e8 * local_d8 * local_110) *
            (dVar11 * 3.0 + dVar13 * dVar11 * -6.0) * dVar14 * 8.0 * local_148) / local_218) /
           (local_180 * dVar9);
  local_278[0] = 0.0;
  local_278[1] = 0.0;
  local_278[2] = 0.0;
  lVar6 = 0;
  do {
    local_278[lVar6] = local_298[lVar6] + local_a8[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  dVar10 = ((local_f0 * local_188 - local_1f8 * local_178 * local_110) * dVar17) / local_208 +
           ((local_f8 * local_188 - local_e8 * local_178 * local_110) * dVar10) / local_218;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  lVar6 = 0;
  do {
    local_c8[lVar6] = local_1d8[lVar6] * dVar10;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_258[0] = 0.0;
  local_258[1] = 0.0;
  local_258[2] = 0.0;
  lVar6 = 0;
  do {
    local_258[lVar6] = local_278[lVar6] + local_c8[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_238[0] = 0.0;
  local_238[1] = 0.0;
  local_238[2] = 0.0;
  lVar6 = 0;
  do {
    local_238[lVar6] = local_258[lVar6] * dVar2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = 0;
  do {
    (idat->f1).super_Vector<double,_3U>.data_[lVar6] =
         local_238[lVar6] + (idat->f1).super_Vector<double,_3U>.data_[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_278[0] = 0.0;
  local_278[1] = 0.0;
  local_278[2] = 0.0;
  lVar6 = 0;
  do {
    local_278[lVar6] = local_168[lVar6] * dVar15;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_298[0] = 0.0;
  local_298[1] = 0.0;
  local_298[2] = 0.0;
  lVar6 = 0;
  do {
    local_298[lVar6] = local_88[lVar6] * dVar19;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_258[0] = 0.0;
  local_258[1] = 0.0;
  local_258[2] = 0.0;
  lVar6 = 0;
  do {
    local_258[lVar6] = local_278[lVar6] - local_298[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_238[0] = 0.0;
  local_238[1] = 0.0;
  local_238[2] = 0.0;
  lVar6 = 0;
  do {
    local_238[lVar6] = local_258[lVar6] * dVar2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = 0;
  do {
    (idat->t1).super_Vector<double,_3U>.data_[lVar6] =
         local_238[lVar6] + (idat->t1).super_Vector<double,_3U>.data_[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_278[0] = 0.0;
  local_278[1] = 0.0;
  local_278[2] = 0.0;
  lVar6 = 0;
  do {
    local_278[lVar6] = local_48[lVar6] * dVar10;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_298[0] = 0.0;
  local_298[1] = 0.0;
  local_298[2] = 0.0;
  lVar6 = 0;
  do {
    local_298[lVar6] = local_88[lVar6] * dVar19;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_258[0] = 0.0;
  local_258[1] = 0.0;
  local_258[2] = 0.0;
  lVar6 = 0;
  do {
    local_258[lVar6] = local_278[lVar6] + local_298[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_238[0] = 0.0;
  local_238[1] = 0.0;
  local_238[2] = 0.0;
  lVar6 = 0;
  do {
    local_238[lVar6] = local_258[lVar6] * dVar2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = 0;
  do {
    (idat->t2).super_Vector<double,_3U>.data_[lVar6] =
         local_238[lVar6] + (idat->t2).super_Vector<double,_3U>.data_[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  idat->vpair = dVar16 + idat->vpair;
  return;
}

Assistant:

void GB::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    GBInteractionData& mixer =
        MixingMap[GBtids[idat.atid1]][GBtids[idat.atid2]];

    RealType sigma0 = mixer.sigma0;
    RealType dw     = mixer.dw;
    RealType eps0   = mixer.eps0;
    RealType x2     = mixer.x2;
    RealType xa2    = mixer.xa2;
    RealType xai2   = mixer.xai2;
    RealType xp2    = mixer.xp2;
    RealType xpap2  = mixer.xpap2;
    RealType xpapi2 = mixer.xpapi2;

    Vector3d ul1 = idat.A1.getRow(2);
    Vector3d ul2 = idat.A2.getRow(2);

    RealType a, b, g;

    if (mixer.i_is_LJ) {
      a   = 0.0;
      ul1 = V3Zero;
    } else {
      a = dot(idat.d, ul1);
    }

    if (mixer.j_is_LJ) {
      b   = 0.0;
      ul2 = V3Zero;
    } else {
      b = dot(idat.d, ul2);
    }

    if (mixer.i_is_LJ || mixer.j_is_LJ)
      g = 0.0;
    else
      g = dot(ul1, ul2);

    RealType au = a / idat.rij;
    RealType bu = b / idat.rij;

    RealType au2 = au * au;
    RealType bu2 = bu * bu;
    RealType g2  = g * g;

    RealType H =
        (xa2 * au2 + xai2 * bu2 - 2.0 * x2 * au * bu * g) / (1.0 - x2 * g2);
    RealType Hp = (xpap2 * au2 + xpapi2 * bu2 - 2.0 * xp2 * au * bu * g) /
                  (1.0 - xp2 * g2);

    RealType sigma = sigma0 / sqrt(1.0 - H);
    RealType e1    = 1.0 / sqrt(1.0 - x2 * g2);
    RealType e2    = 1.0 - Hp;
    RealType eps   = eps0 * pow(e1, nu_) * pow(e2, mu_);
    RealType BigR  = dw * sigma0 / (idat.rij - sigma + dw * sigma0);

    RealType R3  = BigR * BigR * BigR;
    RealType R6  = R3 * R3;
    RealType R7  = R6 * BigR;
    RealType R12 = R6 * R6;
    RealType R13 = R6 * R7;

    RealType U = idat.vdwMult * 4.0 * eps * (R12 - R6);

    RealType s3  = sigma * sigma * sigma;
    RealType s03 = sigma0 * sigma0 * sigma0;

    RealType pref1 =
        -idat.vdwMult * 8.0 * eps * mu_ * (R12 - R6) / (e2 * idat.rij);

    RealType pref2 = idat.vdwMult * 8.0 * eps * s3 * (6.0 * R13 - 3.0 * R7) /
                     (dw * idat.rij * s03);

    RealType dUdr =
        -(pref1 * Hp + pref2 * (sigma0 * sigma0 * idat.rij / s3 + H));

    RealType dUda = pref1 * (xpap2 * au - xp2 * bu * g) / (1.0 - xp2 * g2) +
                    pref2 * (xa2 * au - x2 * bu * g) / (1.0 - x2 * g2);

    RealType dUdb = pref1 * (xpapi2 * bu - xp2 * au * g) / (1.0 - xp2 * g2) +
                    pref2 * (xai2 * bu - x2 * au * g) / (1.0 - x2 * g2);

    RealType dUdg = 4.0 * eps * nu_ * (R12 - R6) * x2 * g / (1.0 - x2 * g2) +
                    8.0 * eps * mu_ * (R12 - R6) *
                        (xp2 * au * bu - Hp * xp2 * g) / (1.0 - xp2 * g2) / e2 +
                    8.0 * eps * s3 * (3.0 * R7 - 6.0 * R13) *
                        (x2 * au * bu - H * x2 * g) / (1.0 - x2 * g2) /
                        (dw * s03);

    Vector3d rhat = idat.d / idat.rij;
    Vector3d rxu1 = cross(idat.d, ul1);
    Vector3d rxu2 = cross(idat.d, ul2);
    Vector3d uxu  = cross(ul1, ul2);

    idat.pot[VANDERWAALS_FAMILY] += U * idat.sw;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += U * idat.sw;

    idat.f1 += (dUdr * rhat + dUda * ul1 + dUdb * ul2) * idat.sw;
    idat.t1 += (dUda * rxu1 - dUdg * uxu) * idat.sw;
    idat.t2 += (dUdb * rxu2 + dUdg * uxu) * idat.sw;
    idat.vpair += U;
    return;
  }